

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O3

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator&=
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *rhs)

{
  ulong *puVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  long lVar5;
  
  if (this->m_num_bits == rhs->m_num_bits) {
    puVar2 = (this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
    if (lVar4 != 0) {
      lVar4 = lVar4 >> 3;
      puVar3 = (rhs->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar5 = 0;
      do {
        puVar1 = puVar2 + lVar5;
        *puVar1 = *puVar1 & puVar3[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    }
    return this;
  }
  __assert_fail("size() == rhs.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                ,0x31a,
                "dynamic_bitset<Block, Allocator> &boost::dynamic_bitset<>::operator&=(const dynamic_bitset<Block, Allocator> &) [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

dynamic_bitset<Block, Allocator>&
dynamic_bitset<Block, Allocator>::operator&=(const dynamic_bitset& rhs)
{
    assert(size() == rhs.size());
    for (size_type i = 0; i < num_blocks(); ++i)
        m_bits[i] &= rhs.m_bits[i];
    return *this;
}